

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resourcefile.cpp
# Opt level: O0

int __thiscall FResourceLump::ReleaseCache(FResourceLump *this)

{
  char cVar1;
  FResourceLump *this_local;
  
  if (((0 < this->LumpSize) && ('\0' < this->RefCount)) &&
     (cVar1 = this->RefCount + -1, this->RefCount = cVar1, cVar1 == '\0')) {
    if (this->Cache != (char *)0x0) {
      operator_delete__(this->Cache);
    }
    this->Cache = (char *)0x0;
  }
  return (int)this->RefCount;
}

Assistant:

int FResourceLump::ReleaseCache()
{
	if (LumpSize > 0 && RefCount > 0)
	{
		if (--RefCount == 0)
		{
			delete [] Cache;
			Cache = NULL;
		}
	}
	return RefCount;
}